

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O3

UModelIndex * __thiscall
TreeModel::findByBase(UModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 base)

{
  undefined4 uVar1;
  size_type sVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  UINT32 UVar6;
  TreeModel *pTVar7;
  int __c;
  UModelIndex *this_00;
  UModelIndex parentIndex;
  UModelIndex currentIndex;
  undefined1 local_d8 [8];
  undefined1 auStack_d0 [16];
  TreeModel *local_c0;
  undefined1 local_b8 [36];
  int local_94;
  UModelIndex *local_90;
  UModelIndex local_88;
  UByteArray local_70;
  UByteArray local_50;
  
  local_b8._0_8_ = (TreeItem *)0xffffffffffffffff;
  local_b8._8_8_ = (TreeItem *)0x0;
  local_b8._16_8_ = (TreeModel *)0x0;
  local_c0 = this;
  local_90 = __return_storage_ptr__;
  index((TreeModel *)local_d8,(char *)this,0);
  if (0 < (int)local_d8._4_4_) {
LAB_0012dbd3:
    local_70.d._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    local_70.d._M_string_length = 0;
    local_70.d.field_2._M_allocated_capacity = 0;
    index((TreeModel *)local_b8,(char *)local_c0,0);
    if ((local_b8._0_4_ == local_d8._0_4_) && (local_b8._8_8_ == auStack_d0._0_8_)) {
      if ((local_b8._4_4_ == local_d8._4_4_) && (local_b8._16_8_ == auStack_d0._8_8_)) {
        local_90->r = -1;
        local_90->c = -1;
        local_90->i = 0;
        local_90->m = (TreeModel *)0x0;
        return local_90;
      }
    }
    local_90->m = (TreeModel *)auStack_d0._8_8_;
    local_90->r = local_d8._0_4_;
    local_90->c = local_d8._4_4_;
    local_90->i = auStack_d0._0_8_;
    return local_90;
  }
  uVar5 = local_d8._4_4_;
LAB_0012dc58:
  pTVar7 = local_c0;
  if ((TreeModel *)auStack_d0._8_8_ != (TreeModel *)0x0) {
    pTVar7 = (TreeModel *)auStack_d0;
  }
  if ((int)local_d8._0_4_ < 0) {
    pTVar7 = local_c0;
  }
  if (uVar5 != 0) {
    pTVar7 = local_c0;
  }
  local_94 = (int)(pTVar7->rootItem->childItems).
                  super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl._M_node._M_size;
  if (0 < local_94) {
    __c = 0;
    do {
      index((TreeModel *)&local_88,(char *)auStack_d0._8_8_,__c);
      this_00 = &local_88;
      UVar6 = TreeModel::base(local_c0,&local_88);
      header((UByteArray *)local_b8,(TreeModel *)this_00,&local_88);
      uVar1 = local_b8._8_4_;
      body(&local_70,(TreeModel *)this_00,&local_88);
      sVar2 = local_70.d._M_string_length;
      tail(&local_50,(TreeModel *)this_00,&local_88);
      iVar3 = (int)local_50.d._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.d._M_dataplus._M_p != &local_50.d.field_2) {
        operator_delete(local_50.d._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.d._M_dataplus._M_p != &local_70.d.field_2) {
        operator_delete(local_70.d._M_dataplus._M_p);
      }
      if ((TreeItem *)local_b8._0_8_ != (TreeItem *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
      if (((local_88.c | local_88.r) < 0 || local_88.m == (TreeModel *)0x0) ||
         (*(bool *)(local_88.i + 0xc9) != true)) {
        if (UVar6 <= base) goto LAB_0012dda7;
      }
      else {
        parent((UModelIndex *)local_b8,local_88.m,&local_88);
        cVar4 = '\0';
        if (((-1 < (int)local_b8._0_4_) && (cVar4 = '\0', -1 < (long)local_b8._0_8_)) &&
           ((TreeModel *)local_b8._16_8_ != (TreeModel *)0x0)) {
          cVar4 = *(bool *)(local_b8._8_8_ + 0xc9);
        }
        if ((UVar6 <= base) && (cVar4 == '\0')) {
LAB_0012dda7:
          if (base < (int)sVar2 + iVar3 + UVar6 + uVar1) goto LAB_0012ddc8;
        }
      }
      __c = __c + 1;
      if (local_94 == __c) break;
    } while( true );
  }
  goto LAB_0012dbd3;
LAB_0012ddc8:
  auStack_d0._8_8_ = local_88.m;
  local_d8 = (undefined1  [8])CONCAT44(local_88.c,local_88.r);
  auStack_d0._0_8_ = local_88.i;
  uVar5 = local_88.c;
  if (0 < local_88.c) goto LAB_0012dbd3;
  goto LAB_0012dc58;
}

Assistant:

UModelIndex TreeModel::findByBase(UINT32 base) const
{
    UModelIndex parentIndex = index(0,0);
    
goDeeper:
    int n = rowCount(parentIndex);
    for (int i = 0; i < n; i++) {
        UModelIndex currentIndex = parentIndex.model()->index(i, 0, parentIndex);
        
        UINT32 currentBase = this->base(currentIndex);
        UINT32 fullSize = (UINT32)(header(currentIndex).size() + body(currentIndex).size() + tail(currentIndex).size());
        if ((compressed(currentIndex) == false || (compressed(currentIndex) == true && compressed(currentIndex.parent()) == false)) // Base is meaningful only for true uncompressed items
            && currentBase <= base && base < currentBase + fullSize) { // Base must be in range [currentBase, currentBase + fullSize)
            // Found a better candidate
            parentIndex = currentIndex;
            goto goDeeper;
        }
    }
    
    return (parentIndex == index(0, 0) ? UModelIndex() : parentIndex);
}